

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_itext_sized
               (LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str,size_t size)

{
  void *pvVar1;
  void *pvVar2;
  char *pcVar3;
  void *insize;
  char *pcVar4;
  long in_RDI;
  char **new_strings;
  char **new_transkeys;
  char **new_langtags;
  char **new_keys;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  pvVar1 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar2 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pcVar3 = (char *)lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  insize = lodepng_realloc(pcVar3,in_stack_ffffffffffffffa8);
  if (pvVar1 != (void *)0x0) {
    *(void **)(in_RDI + 0x68) = pvVar1;
  }
  if (pvVar2 != (void *)0x0) {
    *(void **)(in_RDI + 0x70) = pvVar2;
  }
  if (pcVar3 != (char *)0x0) {
    *(char **)(in_RDI + 0x78) = pcVar3;
  }
  if (insize != (void *)0x0) {
    *(void **)(in_RDI + 0x80) = insize;
  }
  if ((((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) || (pcVar3 == (char *)0x0)) ||
     (insize == (void *)0x0)) {
    local_4 = 0x53;
  }
  else {
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    pcVar4 = alloc_string(pcVar3);
    *(char **)(*(long *)(in_RDI + 0x68) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar4;
    pcVar4 = alloc_string(pcVar3);
    *(char **)(*(long *)(in_RDI + 0x70) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar4;
    pcVar4 = alloc_string(pcVar3);
    *(char **)(*(long *)(in_RDI + 0x78) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar4;
    pcVar3 = alloc_string_sized(pcVar3,(size_t)insize);
    *(char **)(*(long *)(in_RDI + 0x80) + (*(long *)(in_RDI + 0x60) + -1) * 8) = pcVar3;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_add_itext_sized(LodePNGInfo* info, const char* key, const char* langtag,
  const char* transkey, const char* str, size_t size) {
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));

  if (new_keys) info->itext_keys = new_keys;
  if (new_langtags) info->itext_langtags = new_langtags;
  if (new_transkeys) info->itext_transkeys = new_transkeys;
  if (new_strings) info->itext_strings = new_strings;

  if (!new_keys || !new_langtags || !new_transkeys || !new_strings) return 83; /*alloc fail*/

  ++info->itext_num;

  info->itext_keys[info->itext_num - 1] = alloc_string(key);
  info->itext_langtags[info->itext_num - 1] = alloc_string(langtag);
  info->itext_transkeys[info->itext_num - 1] = alloc_string(transkey);
  info->itext_strings[info->itext_num - 1] = alloc_string_sized(str, size);

  return 0;
}